

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3-tiny.cpp
# Opt level: O0

bool load_alphabet(vector<yolo_image,_std::allocator<yolo_image>_> *alphabet)

{
  bool bVar1;
  vector<yolo_image,_std::allocator<yolo_image>_> *in_RDI;
  char fname [256];
  int i;
  int j;
  char local_118 [16];
  size_type in_stack_fffffffffffffef8;
  yolo_image *in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  uint local_18;
  uint local_14;
  
  std::vector<yolo_image,_std::allocator<yolo_image>_>::resize
            ((vector<yolo_image,_std::allocator<yolo_image>_> *)in_stack_ffffffffffffff00,
             in_stack_fffffffffffffef8);
  local_14 = 0;
  do {
    if (7 < (int)local_14) {
      return true;
    }
    for (local_18 = 0x20; (int)local_18 < 0x7f; local_18 = local_18 + 1) {
      snprintf(local_118,0x100,"data/labels/%d_%d.png",(ulong)local_18,(ulong)local_14);
      std::vector<yolo_image,_std::allocator<yolo_image>_>::operator[]
                (in_RDI,(long)(int)(local_14 * 0x80 + local_18));
      bVar1 = load_image(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
      if (!bVar1) {
        fprintf(_stderr,"Cannot load \'%s\'\n",local_118);
        return false;
      }
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

static bool load_alphabet(std::vector<yolo_image> & alphabet)
{
    alphabet.resize(8 * 128);
    for (int j = 0; j < 8; j++) {
        for (int i = 32; i < 127; i++) {
            char fname[256];
            snprintf(fname, sizeof(fname), "data/labels/%d_%d.png", i, j);
            if (!load_image(fname, alphabet[j*128 + i])) {
                fprintf(stderr, "Cannot load '%s'\n", fname);
                return false;
            }
        }
    }
    return true;
}